

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.capnp.c++
# Opt level: O0

Promise<void> __thiscall
capnproto_test::capnp::test::TestPipeline::Server::dispatchCallInternal
          (Server *this,uint16_t methodId,CallContext<capnp::AnyPointer,_capnp::AnyPointer> context)

{
  short sVar1;
  CallContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,_capnproto_test::capnp::test::TestPipeline::GetCapResults>
  CVar2;
  CallContext<capnproto_test::capnp::test::TestPipeline::TestPointersParams,_capnproto_test::capnp::test::TestPipeline::TestPointersResults>
  CVar3;
  CallContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,_capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>
  CVar4;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> in_RCX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *extraout_RDX_01;
  undefined6 in_register_00000032;
  long *plVar6;
  Promise<void> PVar7;
  uint16_t methodId_local;
  Server *this_local;
  CallContext<capnp::AnyPointer,_capnp::AnyPointer> context_local;
  PromiseNode *pPVar5;
  
  plVar6 = (long *)CONCAT62(in_register_00000032,methodId);
  sVar1 = (short)context.hook;
  if (sVar1 == 0) {
    CVar2 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestPipeline::GetCapParams,capnproto_test::capnp::test::TestPipeline::GetCapResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 8))(this,plVar6,CVar2.hook);
    pPVar5 = extraout_RDX;
  }
  else if (sVar1 == 1) {
    CVar3 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestPipeline::TestPointersParams,capnproto_test::capnp::test::TestPipeline::TestPointersResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x10))(this,plVar6,CVar3.hook);
    pPVar5 = extraout_RDX_00;
  }
  else if (sVar1 == 2) {
    CVar4 = ::capnp::Capability::Server::
            internalGetTypedContext<capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>
                      ((Server *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),in_RCX);
    (**(code **)(*plVar6 + 0x18))(this,plVar6,CVar4.hook);
    pPVar5 = extraout_RDX_01;
  }
  else {
    PVar7 = ::capnp::Capability::Server::internalUnimplemented
                      ((Server *)this,(char *)((long)plVar6 + *(long *)(*plVar6 + -0x18)),0x507ab2,
                       0x4cd0);
    pPVar5 = PVar7.super_PromiseBase.node.ptr;
  }
  PVar7.super_PromiseBase.node.ptr = pPVar5;
  PVar7.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar7.super_PromiseBase.node;
}

Assistant:

::kj::Promise<void> TestPipeline::Server::dispatchCallInternal(
    uint16_t methodId,
    ::capnp::CallContext< ::capnp::AnyPointer, ::capnp::AnyPointer> context) {
  switch (methodId) {
    case 0:
      return getCap(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestPipeline::GetCapParams,  ::capnproto_test::capnp::test::TestPipeline::GetCapResults>(context));
    case 1:
      return testPointers(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestPipeline::TestPointersParams,  ::capnproto_test::capnp::test::TestPipeline::TestPointersResults>(context));
    case 2:
      return getAnyCap(::capnp::Capability::Server::internalGetTypedContext<
           ::capnproto_test::capnp::test::TestPipeline::GetAnyCapParams,  ::capnproto_test::capnp::test::TestPipeline::GetAnyCapResults>(context));
    default:
      (void)context;
      return ::capnp::Capability::Server::internalUnimplemented(
          "capnp/test.capnp:TestPipeline",
          0xa5a404caa61d4cd0ull, methodId);
  }
}